

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteObservations.cpp
# Opt level: O0

string * __thiscall
MADPComponentDiscreteObservations::SoftPrint_abi_cxx11_(MADPComponentDiscreteObservations *this)

{
  ostream *poVar1;
  MADPComponentDiscreteObservations *this_00;
  size_t sVar2;
  void *this_01;
  string *in_RDI;
  stringstream ss;
  MADPComponentDiscreteObservations *in_stack_00000158;
  MADPComponentDiscreteObservations *in_stack_00000198;
  string local_1e8 [32];
  string local_1c8 [48];
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,"MADPComponentDiscreteObservations::Print()");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  this_00 = (MADPComponentDiscreteObservations *)std::operator<<(local_188,"#joint observations=");
  sVar2 = GetNrJointObservations(this_00);
  this_01 = (void *)std::ostream::operator<<(this_00,sVar2);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  SoftPrintObservationSets_abi_cxx11_(in_stack_00000198);
  std::operator<<(local_188,local_1c8);
  std::__cxx11::string::~string(local_1c8);
  poVar1 = std::operator<<(local_188,"Joint Observations:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  SoftPrintJointObservationSet_abi_cxx11_(in_stack_00000158);
  std::operator<<(local_188,local_1e8);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string MADPComponentDiscreteObservations::SoftPrint() const
{
    stringstream ss;
    ss << "MADPComponentDiscreteObservations::Print()" << endl;    
    ss << "#joint observations="<<GetNrJointObservations()<<endl;
    ss << SoftPrintObservationSets();
    ss << "Joint Observations:"<<endl;
    ss << SoftPrintJointObservationSet();    
    return(ss.str());
}